

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output_classes.h
# Opt level: O0

unique_ptr<output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>,_std::default_delete<output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>_>_>
 get_output<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
           (flagser_parameters *params)

{
  bool bVar1;
  invalid_argument *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string err_msg;
  char *in_stack_ffffffffffffff68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  string *__rhs;
  _Head_base<0UL,_output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>_*,_false>
  this_00;
  flagser_parameters *in_stack_ffffffffffffff88;
  string local_68 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  
  this_00._M_head_impl =
       (output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
        *)in_RDI;
  bVar1 = std::operator==(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  if (bVar1) {
    std::
    make_unique<betti_output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>,flagser_parameters_const&>
              (in_stack_ffffffffffffff88);
    std::
    unique_ptr<output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>,std::default_delete<output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>>>
    ::
    unique_ptr<betti_output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>,std::default_delete<betti_output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>>,void>
              ((unique_ptr<output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>,_std::default_delete<output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>_>_>
                *)this_00._M_head_impl,
               (unique_ptr<betti_output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>,_std::default_delete<betti_output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>_>_>
                *)in_RDI);
    std::
    unique_ptr<betti_output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>,_std::default_delete<betti_output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>_>_>
    ::~unique_ptr((unique_ptr<betti_output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>,_std::default_delete<betti_output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>_>_>
                   *)in_stack_ffffffffffffff70);
  }
  else {
    bVar1 = std::operator==(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    if (bVar1) {
      std::
      make_unique<barcode_output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>,flagser_parameters_const&>
                (in_stack_ffffffffffffff88);
      std::
      unique_ptr<output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>,std::default_delete<output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>>>
      ::
      unique_ptr<barcode_output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>,std::default_delete<barcode_output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>>,void>
                ((unique_ptr<output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>,_std::default_delete<output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>_>_>
                  *)this_00._M_head_impl,
                 (unique_ptr<barcode_output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>,_std::default_delete<barcode_output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>_>_>
                  *)in_RDI);
      std::
      unique_ptr<barcode_output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>,_std::default_delete<barcode_output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>_>_>
      ::~unique_ptr((unique_ptr<barcode_output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>,_std::default_delete<barcode_output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>_>_>
                     *)in_stack_ffffffffffffff70);
    }
    else {
      bVar1 = std::operator==(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      if (!bVar1) {
        __rhs = local_68;
        std::operator+(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
        std::operator+(in_RDI,(char *)__rhs);
        std::__cxx11::string::~string(local_68);
        this = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument(this,(string *)&stack0xffffffffffffffb8);
        __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
      }
      std::
      make_unique<trivial_output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>,flagser_parameters_const&>
                (in_stack_ffffffffffffff88);
      std::
      unique_ptr<output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>,std::default_delete<output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>>>
      ::
      unique_ptr<trivial_output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>,std::default_delete<trivial_output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>>,void>
                ((unique_ptr<output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>,_std::default_delete<output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>_>_>
                  *)this_00._M_head_impl,
                 (unique_ptr<trivial_output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>,_std::default_delete<trivial_output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>_>_>
                  *)in_RDI);
      std::
      unique_ptr<trivial_output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>,_std::default_delete<trivial_output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>_>_>
      ::~unique_ptr((unique_ptr<trivial_output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>,_std::default_delete<trivial_output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>_>_>
                     *)in_stack_ffffffffffffff70);
    }
  }
  return (__uniq_ptr_data<output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>,_std::default_delete<output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>_>,_true,_true>
          )(tuple<output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>_*,_std::default_delete<output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>_>_>
            )this_00._M_head_impl;
}

Assistant:

std::unique_ptr<output_t<Complex>> get_output(const flagser_parameters& params) {
	// using std namespace because of std::make_unique workaround
	// This restrict the scope to inside the function
	using namespace std;

	if (params.output_format == "betti") return make_unique<betti_output_t<Complex>>(params);
	if (params.output_format == "barcode") return make_unique<barcode_output_t<Complex>>(params);

	if (params.output_format == "none") return make_unique<trivial_output_t<Complex>>(params);

#ifdef WITH_HDF5
	if (params.output_format == "barcode:hdf5") return make_unique<barcode_hdf5_output_t<Complex>>(params);
#endif

	std::string err_msg = "The output format \"" + params.output_format + "\" could not be found.";
	throw std::invalid_argument(err_msg);
}